

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdevice.cpp
# Opt level: O0

QList<int> * __thiscall QPrintDevice::supportedResolutions(QPrintDevice *this)

{
  bool bVar1;
  QPlatformPrintDevice *pQVar2;
  QList<int> *in_RDI;
  QList<int> *pQVar3;
  
  pQVar3 = in_RDI;
  bVar1 = isValid((QPrintDevice *)in_RDI);
  if (bVar1) {
    pQVar2 = QSharedPointer<QPlatformPrintDevice>::operator->
                       ((QSharedPointer<QPlatformPrintDevice> *)0x138c9d);
    (*pQVar2->_vptr_QPlatformPrintDevice[0x19])(in_RDI);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x138cc8);
  }
  return pQVar3;
}

Assistant:

QList<int> QPrintDevice::supportedResolutions() const
{
    return isValid() ? d->supportedResolutions() : QList<int>();
}